

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scatter.cpp
# Opt level: O3

void __thiscall
zmq::scatter_t::xattach_pipe
          (scatter_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  pipe_t::set_nodelay(pipe_);
  lb_t::attach(&this->_lb,pipe_);
  return;
}

Assistant:

void zmq::scatter_t::xattach_pipe (pipe_t *pipe_,
                                   bool subscribe_to_all_,
                                   bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    //  Don't delay pipe termination as there is no one
    //  to receive the delimiter.
    pipe_->set_nodelay ();

    zmq_assert (pipe_);
    _lb.attach (pipe_);
}